

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O2

unsigned_long elf_hash(char *_name)

{
  ulong uVar1;
  uint uVar2;
  unsigned_long uVar3;
  
  uVar3 = 0;
  for (; (ulong)(byte)*_name != 0; _name = (char *)((byte *)_name + 1)) {
    uVar1 = uVar3 * 0x10 + (ulong)(byte)*_name;
    uVar2 = (uint)uVar1 & 0xf0000000;
    uVar3 = ~(ulong)uVar2 & (uVar2 >> 0x18 ^ uVar1);
  }
  return uVar3;
}

Assistant:

unsigned long elf_hash(const char *_name)
/* calculate a hash code as used in ELF objects */
{
  const unsigned char *name=(const unsigned char *)_name;
  unsigned long h=0,g;

  while (*name) {
    h = (h << 4) + *name++;
    if (g = h & 0xf0000000)
      h ^= g >> 24;
    h &= ~g;
  }
  return h;
}